

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_test.cc
# Opt level: O2

bool SetupContext(FileTest *t,KeyMap *key_map,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  FileTest *pFVar4;
  EVP_MD *pEVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  allocator<char> local_71;
  UniquePtr<uint8_t> buf;
  AssertHelper local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> label;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"RSAPadding",(allocator<char> *)&label);
  bVar1 = FileTest::HasAttribute(t,(string *)&buf);
  std::__cxx11::string::~string((string *)&buf);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&buf,"RSAPadding",&local_71);
    psVar3 = FileTest::GetAttributeOrDie(t,(string *)&buf);
    bVar1 = std::operator==(psVar3,"PKCS1");
    if (bVar1) {
      iVar2 = 1;
    }
    else {
      bVar1 = std::operator==(psVar3,"PSS");
      if (bVar1) {
        iVar2 = 6;
      }
      else {
        bVar1 = std::operator==(psVar3,"OAEP");
        if (bVar1) {
          iVar2 = 4;
        }
        else {
          bVar1 = std::operator==(psVar3,"None");
          if (!bVar1) {
            testing::Message::Message((Message *)&label);
            std::operator<<((ostream *)
                            (label.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_start + 0x10),
                            "Unknown RSA padding mode: ");
            std::operator<<((ostream *)
                            (label.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_start + 0x10),(string *)psVar3);
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                       ,0x67,"Failed");
            testing::internal::AssertHelper::operator=(&local_50,(Message *)&label);
            goto LAB_0025aa81;
          }
          iVar2 = 3;
        }
      }
    }
    iVar2 = EVP_PKEY_CTX_set_rsa_padding(ctx,iVar2);
    std::__cxx11::string::~string((string *)&buf);
    if (iVar2 == 0) {
      return false;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"PSSSaltLength",(allocator<char> *)&local_50);
  bVar1 = FileTest::HasAttribute(t,(string *)&buf);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&label,"PSSSaltLength",&local_71);
    psVar3 = FileTest::GetAttributeOrDie(t,(string *)&label);
    iVar2 = atoi((psVar3->_M_dataplus)._M_p);
    iVar2 = EVP_PKEY_CTX_set_rsa_pss_saltlen(ctx,iVar2);
    std::__cxx11::string::~string((string *)&label);
    std::__cxx11::string::~string((string *)&buf);
    if (iVar2 == 0) {
      return false;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&buf);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"MGF1Digest",(allocator<char> *)&label);
  bVar1 = FileTest::HasAttribute(t,(string *)&buf);
  std::__cxx11::string::~string((string *)&buf);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,"MGF1Digest",(allocator<char> *)&label);
    psVar3 = (string *)&buf;
    pFVar4 = (FileTest *)FileTest::GetAttributeOrDie(t,psVar3);
    pEVar5 = GetDigest(pFVar4,psVar3);
    std::__cxx11::string::~string((string *)&buf);
    if (pEVar5 == (EVP_MD *)0x0) {
      return false;
    }
    iVar2 = EVP_PKEY_CTX_set_rsa_mgf1_md(ctx,pEVar5);
    if (iVar2 == 0) {
      return false;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"OAEPDigest",(allocator<char> *)&label);
  bVar1 = FileTest::HasAttribute(t,(string *)&buf);
  std::__cxx11::string::~string((string *)&buf);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,"OAEPDigest",(allocator<char> *)&label);
    psVar3 = (string *)&buf;
    pFVar4 = (FileTest *)FileTest::GetAttributeOrDie(t,psVar3);
    pEVar5 = GetDigest(pFVar4,psVar3);
    std::__cxx11::string::~string((string *)&buf);
    if (pEVar5 == (EVP_MD *)0x0) {
      return false;
    }
    iVar2 = EVP_PKEY_CTX_set_rsa_oaep_md(ctx,pEVar5);
    if (iVar2 == 0) {
      return false;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"OAEPLabel",(allocator<char> *)&label);
  bVar1 = FileTest::HasAttribute(t,(string *)&buf);
  std::__cxx11::string::~string((string *)&buf);
  if (bVar1) {
    label.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    label.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    label.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,"OAEPLabel",(allocator<char> *)&local_50);
    bVar1 = FileTest::GetBytes(t,&label,(string *)&buf);
    std::__cxx11::string::~string((string *)&buf);
    if (!bVar1) {
LAB_0025a9b2:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&label.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return false;
    }
    buf._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
         OPENSSL_memdup(label.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)label.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)label.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    if (((tuple<unsigned_char_*,_bssl::internal::Deleter>)
         buf._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl ==
         (_Head_base<0UL,_unsigned_char_*,_false>)0x0) ||
       (iVar2 = EVP_PKEY_CTX_set0_rsa_oaep_label
                          (ctx,(uint8_t *)
                               buf._M_t.
                               super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                           (long)label.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)label.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start), iVar2 == 0)) {
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&buf);
      goto LAB_0025a9b2;
    }
    buf._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>)0x0;
    std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&buf);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&label.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"DerivePeer",(allocator<char> *)&label);
  bVar1 = FileTest::HasAttribute(t,(string *)&buf);
  std::__cxx11::string::~string((string *)&buf);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&label,"DerivePeer",(allocator<char> *)&local_50);
    psVar3 = FileTest::GetAttributeOrDie(t,(string *)&label);
    std::__cxx11::string::string((string *)&buf,(string *)psVar3);
    std::__cxx11::string::~string((string *)&label);
    sVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>_>_>_>
            ::count(key_map,(key_type *)&buf);
    if (sVar6 == 0) {
      testing::Message::Message((Message *)&label);
      std::operator<<((ostream *)
                      (label.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + 0x10),"Could not find key ");
      std::operator<<((ostream *)
                      (label.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + 0x10),(string *)&buf);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                 ,0x135,"Failed");
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&label);
LAB_0025aa81:
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (label.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)label.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
      std::__cxx11::string::~string((string *)&buf);
      return false;
    }
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>_>_>_>
             ::operator[](key_map,(key_type *)&buf);
    iVar2 = EVP_PKEY_derive_set_peer
                      ((EVP_PKEY_CTX *)ctx,
                       (EVP_PKEY *)
                       (pmVar7->_M_t).super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
    std::__cxx11::string::~string((string *)&buf);
    if (iVar2 == 0) {
      return false;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"DiffieHellmanPad",(allocator<char> *)&label);
  bVar1 = FileTest::HasAttribute(t,(string *)&buf);
  if (bVar1) {
    iVar2 = EVP_PKEY_CTX_set_dh_pad(ctx,1);
    std::__cxx11::string::~string((string *)&buf);
    if (iVar2 == 0) {
      return false;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&buf);
  }
  return true;
}

Assistant:

static bool SetupContext(FileTest *t, KeyMap *key_map, EVP_PKEY_CTX *ctx) {
  if (t->HasAttribute("RSAPadding")) {
    int padding;
    if (!GetRSAPadding(t, &padding, t->GetAttributeOrDie("RSAPadding")) ||
        !EVP_PKEY_CTX_set_rsa_padding(ctx, padding)) {
      return false;
    }
  }
  if (t->HasAttribute("PSSSaltLength") &&
      !EVP_PKEY_CTX_set_rsa_pss_saltlen(
          ctx, atoi(t->GetAttributeOrDie("PSSSaltLength").c_str()))) {
    return false;
  }
  if (t->HasAttribute("MGF1Digest")) {
    const EVP_MD *digest = GetDigest(t, t->GetAttributeOrDie("MGF1Digest"));
    if (digest == nullptr || !EVP_PKEY_CTX_set_rsa_mgf1_md(ctx, digest)) {
      return false;
    }
  }
  if (t->HasAttribute("OAEPDigest")) {
    const EVP_MD *digest = GetDigest(t, t->GetAttributeOrDie("OAEPDigest"));
    if (digest == nullptr || !EVP_PKEY_CTX_set_rsa_oaep_md(ctx, digest)) {
      return false;
    }
  }
  if (t->HasAttribute("OAEPLabel")) {
    std::vector<uint8_t> label;
    if (!t->GetBytes(&label, "OAEPLabel")) {
      return false;
    }
    // For historical reasons, |EVP_PKEY_CTX_set0_rsa_oaep_label| expects to be
    // take ownership of the input.
    bssl::UniquePtr<uint8_t> buf(reinterpret_cast<uint8_t *>(
        OPENSSL_memdup(label.data(), label.size())));
    if (!buf ||
        !EVP_PKEY_CTX_set0_rsa_oaep_label(ctx, buf.get(), label.size())) {
      return false;
    }
    buf.release();
  }
  if (t->HasAttribute("DerivePeer")) {
    std::string derive_peer = t->GetAttributeOrDie("DerivePeer");
    if (key_map->count(derive_peer) == 0) {
      ADD_FAILURE() << "Could not find key " << derive_peer;
      return false;
    }
    EVP_PKEY *derive_peer_key = (*key_map)[derive_peer].get();
    if (!EVP_PKEY_derive_set_peer(ctx, derive_peer_key)) {
      return false;
    }
  }
  if (t->HasAttribute("DiffieHellmanPad") && !EVP_PKEY_CTX_set_dh_pad(ctx, 1)) {
    return false;
  }
  return true;
}